

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  size_type sVar2;
  cmCommand *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  BOM BVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined7 uVar16;
  undefined8 uVar13;
  undefined7 extraout_var;
  string *psVar14;
  ostream *poVar15;
  BOM BVar17;
  uint uVar18;
  undefined1 uVar19;
  uint uVar20;
  string *unaff_RBX;
  string *sr;
  pointer pbVar21;
  undefined4 uVar22;
  ulong uVar23;
  char cVar24;
  size_type sVar25;
  undefined4 uVar26;
  string *psVar27;
  int limit_output;
  string output;
  int limit_input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  string outVar;
  string s;
  ifstream fin;
  RegularExpression regex;
  uint local_55c;
  int local_558;
  uint local_554;
  cmCommand *local_550;
  undefined8 local_548;
  pointer local_540;
  string local_538;
  undefined8 local_518;
  int local_50c;
  ulong local_508;
  ulong local_500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  uint local_4d4;
  string local_4d0;
  ulong local_4b0;
  string local_4a8;
  undefined1 local_488 [112];
  ios_base local_418 [264];
  ulong local_310;
  undefined1 local_308 [16];
  string local_2f8 [3];
  ios_base local_298 [408];
  RegularExpression local_100;
  
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21) < 0x41) {
    local_308._0_8_ = local_2f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"STRINGS requires a file name and output variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
    if ((string *)local_308._0_8_ != local_2f8) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_2f8[0]._M_dataplus._M_p + 1));
    }
    uVar19 = 0;
  }
  else {
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    pcVar1 = pbVar21[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,pcVar1,pcVar1 + pbVar21[1]._M_string_length);
    bVar4 = cmsys::SystemTools::FileIsFullPath(&local_4d0);
    if (!bVar4) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::_M_assign((string *)&local_4d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     "/",(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::_M_append((char *)&local_4d0,local_308._0_8_);
      if ((string *)local_308._0_8_ != local_2f8) {
        operator_delete((void *)local_308._0_8_,(ulong)(local_2f8[0]._M_dataplus._M_p + 1));
      }
    }
    pbVar21 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    pcVar1 = pbVar21[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a8,pcVar1,pcVar1 + pbVar21[2]._M_string_length);
    local_50c = -1;
    local_558 = -1;
    local_100.regmatch.startp[0] = (char *)0x0;
    local_100.regmatch.endp[0] = (char *)0x0;
    local_100.regmatch.searchstring = (char *)0x0;
    local_100.program = (char *)0x0;
    pbVar21 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21;
    bVar4 = 0x60 < uVar12;
    uVar16 = (undefined7)(uVar12 >> 8);
    local_550 = &this->super_cmCommand;
    if (bVar4) {
      local_540 = (pointer)CONCAT44(local_540._4_4_,(int)CONCAT71(uVar16,1));
      local_518 = (ulong)local_518._4_4_ << 0x20;
      local_554 = 0;
      local_55c = 0;
      uVar26 = 0;
      local_548 = 0;
      local_500 = 0;
      local_508 = 0;
      psVar14 = (string *)0x3;
      psVar27 = (string *)&DAT_00000004;
LAB_0020727c:
      unaff_RBX = (string *)((long)psVar14 * 0x20);
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21));
      if (iVar6 == 0) {
        uVar26 = 1;
        goto LAB_00207811;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
      if (iVar6 == 0) {
        uVar26 = 2;
        goto LAB_00207811;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
      if (iVar6 == 0) {
        uVar26 = 3;
        goto LAB_00207811;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
      if (iVar6 == 0) {
        uVar26 = 4;
        goto LAB_00207811;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
      if (iVar6 == 0) {
        uVar26 = 5;
        goto LAB_00207811;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
      if (iVar6 == 0) {
        uVar26 = 7;
        goto LAB_00207811;
      }
      uVar13 = std::__cxx11::string::compare
                         ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start));
      if ((int)uVar13 == 0) {
        local_500 = CONCAT71((int7)((ulong)uVar13 >> 8),1);
        uVar26 = 0;
        goto LAB_00207811;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
      uVar22 = 0;
      if (iVar6 == 0) {
        local_540 = (pointer)((ulong)local_540 & 0xffffffff00000000);
        uVar26 = uVar22;
        goto LAB_00207811;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
      if (iVar6 == 0) {
        uVar26 = 8;
        goto LAB_00207811;
      }
      uVar20 = local_55c;
      switch(uVar26) {
      case 1:
        iVar6 = __isoc99_sscanf(*(undefined8 *)
                                 ((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start),"%d",&local_50c);
        if ((iVar6 == 1) && (uVar26 = 0, -1 < local_50c)) goto LAB_00207811;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LIMIT_INPUT value \"",0x22);
        pcVar3 = local_550;
        pbVar21 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,
                             *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21),
                             *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar3,(string *)local_488);
        break;
      case 2:
        iVar6 = __isoc99_sscanf(*(undefined8 *)
                                 ((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start),"%d",&local_558);
        if ((iVar6 == 1) && (uVar26 = 0, -1 < local_558)) goto LAB_00207811;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LIMIT_OUTPUT value \"",0x23);
        pcVar3 = local_550;
        pbVar21 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,
                             *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21),
                             *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar3,(string *)local_488);
        break;
      case 3:
        uVar26 = 0;
        iVar6 = __isoc99_sscanf(*(undefined8 *)
                                 ((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start),"%d",&local_538);
        bVar5 = -1 < (int)(uint)local_538._M_dataplus._M_p && iVar6 == 1;
        uVar20 = (uint)local_538._M_dataplus._M_p;
        uVar9 = local_554;
        if (-1 >= (int)(uint)local_538._M_dataplus._M_p || iVar6 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LIMIT_COUNT value \"",0x22);
          pbVar21 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,
                               *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21),
                               *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"\" is not an unsigned integer.",0x1d);
          unaff_RBX = (string *)local_488;
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_550,unaff_RBX);
          if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
            operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          uVar26 = 3;
          uVar20 = local_55c;
          uVar9 = local_554;
        }
        goto LAB_002077eb;
      case 4:
        uVar26 = 0;
        iVar7 = __isoc99_sscanf(*(undefined8 *)
                                 ((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start),"%d",&local_538);
        bVar5 = -1 < (int)(uint)local_538._M_dataplus._M_p && iVar7 == 1;
        iVar6 = (uint)local_538._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_538._M_dataplus._M_p || iVar7 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LENGTH_MINIMUM value \"",0x25);
          pbVar21 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,
                               *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21),
                               *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"\" is not an unsigned integer.",0x1d);
          unaff_RBX = (string *)local_488;
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_550,unaff_RBX);
          if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
            operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          uVar26 = 4;
          iVar6 = (int)local_518;
        }
        local_518 = CONCAT44(local_518._4_4_,iVar6);
        uVar9 = local_554;
        goto LAB_002077eb;
      case 5:
        uVar26 = 0;
        iVar6 = __isoc99_sscanf(*(undefined8 *)
                                 ((long)&(unaff_RBX->_M_dataplus)._M_p +
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start),"%d",&local_538);
        bVar5 = -1 < (int)(uint)local_538._M_dataplus._M_p && iVar6 == 1;
        uVar9 = (uint)local_538._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_538._M_dataplus._M_p || iVar6 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LENGTH_MAXIMUM value \"",0x25);
          pbVar21 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,
                               *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21),
                               *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"\" is not an unsigned integer.",0x1d);
          unaff_RBX = (string *)local_488;
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_550,unaff_RBX);
          if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
            operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          uVar26 = 5;
          uVar9 = local_554;
        }
LAB_002077eb:
        local_554 = uVar9;
        local_55c = uVar20;
        if (bVar5) goto LAB_00207811;
        goto LAB_00207870;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS given unknown argument \"",0x20);
        pcVar3 = local_550;
        pbVar21 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,
                             *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21),
                             *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21));
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar3,(string *)local_488);
        break;
      case 7:
        bVar5 = cmsys::RegularExpression::compile
                          (&local_100,
                           *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                     (long)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start));
        if (bVar5) {
          local_508 = CONCAT71(extraout_var,1);
          uVar26 = 0;
          goto LAB_00207811;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option REGEX value \"",0x1c);
        pcVar3 = local_550;
        pbVar21 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,
                             *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p + (long)pbVar21),
                             *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21));
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" could not be compiled.",0x18)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar3,(string *)local_488);
        break;
      case 8:
        iVar6 = std::__cxx11::string::compare
                          ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                   (long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start));
        if (iVar6 == 0) {
          local_548 = 1;
          uVar26 = uVar22;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                     (long)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start));
          if (iVar6 == 0) {
            local_548 = 3;
            uVar26 = uVar22;
          }
          else {
            iVar6 = std::__cxx11::string::compare
                              ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                       (long)(args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start));
            if (iVar6 == 0) {
              local_548 = 2;
              uVar26 = uVar22;
            }
            else {
              iVar6 = std::__cxx11::string::compare
                                ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                         (long)(args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start));
              if (iVar6 == 0) {
                local_548 = 5;
                uVar26 = uVar22;
              }
              else {
                iVar6 = std::__cxx11::string::compare
                                  ((char *)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                           (long)(args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start));
                if (iVar6 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,"STRINGS option ENCODING \"",0x19);
                  pbVar21 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_308,
                                       *(char **)((long)&(unaff_RBX->_M_dataplus)._M_p +
                                                 (long)pbVar21),
                                       *(long *)((long)&unaff_RBX->_M_string_length + (long)pbVar21)
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"\" not recognized.",0x11);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(local_550,(string *)local_488);
                  break;
                }
                local_548 = 4;
                uVar26 = uVar22;
              }
            }
          }
        }
        goto LAB_00207811;
      }
      if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
        operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      goto LAB_00207870;
    }
    local_548 = 0;
    local_540 = (pointer)CONCAT44(local_540._4_4_,(int)CONCAT71(uVar16,1));
    local_508 = 0;
    local_500 = 0;
    local_55c = 0;
    local_554 = 0;
    local_518 = (ulong)local_518._4_4_ << 0x20;
LAB_00207870:
    pcVar3 = local_550;
    if (bVar4) {
      uVar19 = 0;
    }
    else {
      if (((ulong)local_540 & 1) != 0) {
        psVar14 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_550->Makefile);
        unaff_RBX = local_2f8;
        pcVar1 = (psVar14->_M_dataplus)._M_p;
        local_308._0_8_ = unaff_RBX;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,pcVar1,pcVar1 + psVar14->_M_string_length);
        std::__cxx11::string::append(local_308);
        std::__cxx11::string::append(local_308);
        bVar4 = cmHexFileConverter::TryConvert(&local_4d0,(string *)local_308);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)&local_4d0);
        }
        if ((string *)local_308._0_8_ != unaff_RBX) {
          operator_delete((void *)local_308._0_8_,(ulong)(local_2f8[0]._M_dataplus._M_p + 1));
        }
      }
      std::ifstream::ifstream(local_308,local_4d0._M_dataplus._M_p,_S_in);
      bVar4 = (local_2f8[0].field_2._M_local_buf[*(size_type *)(local_308._0_8_ + -0x18)] & 5U) == 0
      ;
      uVar12 = CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar4);
      if (bVar4) {
        local_4d4 = (uint)uVar12;
        BVar8 = cmsys::FStream::ReadBOM((istream *)local_308);
        BVar17 = (BOM)local_548;
        if (BVar8 == BOM_None) {
          BVar8 = BVar17;
        }
        if (BVar17 != BOM_None) {
          BVar8 = BVar17;
        }
        local_548 = CONCAT44(local_548._4_4_,BVar8);
        uVar20 = 3;
        if ((BVar8 & ~BOM_UTF8) != BOM_UTF32BE) {
          uVar20 = (uint)((BVar8 & ~BOM_UTF8) == BOM_UTF16BE);
        }
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_488._0_8_ = local_488 + 0x10;
        local_488._8_8_ = 0;
        local_488[0x10] = '\0';
        local_4b0 = (ulong)local_55c;
        local_518 = local_518 & 0xffffffff;
        local_310 = (ulong)local_554;
        pbVar21 = (pointer)0x0;
        do {
          if ((((local_55c != 0) &&
               (local_4b0 <=
                (ulong)((long)local_4f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_4f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5))) ||
              ((-1 < local_50c && (iVar6 = std::istream::tellg(), local_50c <= iVar6)))) ||
             ((local_2f8[0].field_2._M_local_buf[*(size_type *)(local_308._0_8_ + -0x18)] & 5U) != 0
             )) break;
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          local_538._M_string_length = 0;
          local_538.field_2._M_local_buf[0] = '\0';
          uVar9 = std::istream::get();
          cVar24 = (char)local_308;
          local_540 = pbVar21;
          if (uVar20 != 0) {
            uVar11 = 1;
            do {
              uVar10 = std::istream::get();
              uVar18 = *(uint *)((long)&local_2f8[0].field_2 +
                                *(size_type *)(local_308._0_8_ + -0x18));
              if ((uVar18 & 5) == 0) {
                uVar9 = uVar9 << 8 | uVar10;
              }
              else {
                std::istream::putback(cVar24);
              }
            } while (((uVar18 & 5) == 0) && (bVar4 = uVar11 < uVar20, uVar11 = uVar11 + 1, bVar4));
          }
          pbVar21 = local_540;
          if ((int)local_548 == 5) {
            uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          }
          else if ((int)local_548 == 3) {
            uVar9 = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
          }
          if (uVar9 == 0xd) {
LAB_00207e8d:
            bVar4 = false;
          }
          else {
            if (uVar9 < 0x100) {
              iVar6 = isprint(uVar9);
              if ((byte)(uVar9 == 10 & (byte)local_500 | (uVar9 == 9 || iVar6 != 0)) != 1)
              goto LAB_00207beb;
              std::__cxx11::string::push_back((char)&local_538);
            }
            else {
LAB_00207beb:
              if ((int)local_548 == 1) {
                uVar12 = 0;
                do {
                  uVar11 = HandleStringsCommand::utf8_check_table[uVar12][0] & uVar9;
                  uVar23 = uVar12 + 1;
                  uVar18 = (uint)HandleStringsCommand::utf8_check_table[uVar12][1];
                  if (uVar11 == uVar18) break;
                  bVar4 = uVar12 < 2;
                  uVar12 = uVar23;
                } while (bVar4);
                uVar10 = (int)uVar23 + 1;
                if (uVar11 != uVar18) {
                  uVar10 = 0;
                }
                if (uVar11 == uVar18) {
                  iVar6 = 0;
                  do {
                    if ((iVar6 != 0) &&
                       ((uVar9 = std::istream::get(), (uVar9 & 0xc0) != 0x80 ||
                        ((*(uint *)((long)&local_2f8[0].field_2 +
                                   *(size_type *)(local_308._0_8_ + -0x18)) & 5) != 0)))) {
                      std::istream::putback(cVar24);
                      break;
                    }
                    std::__cxx11::string::push_back((char)&local_538);
                    iVar6 = iVar6 + 1;
                  } while (uVar10 + (uVar10 == 0) != iVar6);
                }
                pbVar21 = local_540;
                if (local_538._M_string_length != uVar10) {
                  if (local_538._M_string_length != 1) {
                    uVar12 = 0;
                    uVar23 = 1;
                    do {
                      uVar9 = (uint)local_538._M_dataplus._M_p[~uVar12 + local_538._M_string_length]
                      ;
                      std::istream::putback(cVar24);
                      bVar4 = uVar23 < local_538._M_string_length - 1;
                      uVar12 = uVar23;
                      uVar23 = (ulong)((int)uVar23 + 1);
                    } while (bVar4);
                  }
                  local_538._M_string_length = 0;
                  *local_538._M_dataplus._M_p = '\0';
                }
              }
            }
            if (uVar9 == 10 && (local_500 & 1) == 0) {
              if (((ulong)local_488._8_8_ < local_518) ||
                 (((local_508 & 1) != 0 &&
                  (bVar4 = cmsys::RegularExpression::find
                                     (&local_100,(char *)local_488._0_8_,&local_100.regmatch),
                  !bVar4)))) {
LAB_00207e08:
                local_488._8_8_ = 0;
                *(char *)local_488._0_8_ = '\0';
                goto LAB_00207e1f;
              }
              uVar9 = (int)pbVar21 + local_488._8_4_ + 1;
              pbVar21 = (pointer)(ulong)uVar9;
              if ((local_558 < 0) || ((int)uVar9 < local_558)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4f8,(value_type *)local_488);
                goto LAB_00207e08;
              }
LAB_00207e7c:
              local_488._8_8_ = 0;
              bVar4 = true;
            }
            else {
              if (local_538._M_string_length == 0) {
                if ((local_488._8_8_ != 0 && local_518 <= (ulong)local_488._8_8_) &&
                   (((local_508 & 1) == 0 ||
                    (bVar4 = cmsys::RegularExpression::find
                                       (&local_100,(char *)local_488._0_8_,&local_100.regmatch),
                    bVar4)))) {
                  uVar9 = (int)pbVar21 + local_488._8_4_ + 1;
                  pbVar21 = (pointer)(ulong)uVar9;
                  if ((-1 < local_558) && (local_558 <= (int)uVar9)) goto LAB_00207e7c;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_4f8,(value_type *)local_488);
                }
                goto LAB_00207e08;
              }
              std::__cxx11::string::_M_append(local_488,(ulong)local_538._M_dataplus._M_p);
LAB_00207e1f:
              if ((local_554 == 0) || (local_488._8_8_ != local_310)) goto LAB_00207e8d;
              if ((local_518 <= (ulong)local_488._8_8_) &&
                 (((local_508 & 1) == 0 ||
                  (bVar4 = cmsys::RegularExpression::find
                                     (&local_100,(char *)local_488._0_8_,&local_100.regmatch), bVar4
                  )))) {
                uVar9 = (int)pbVar21 + local_488._8_4_ + 1;
                pbVar21 = (pointer)(ulong)uVar9;
                if ((-1 < local_558) && (local_558 <= (int)uVar9)) goto LAB_00207e7c;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4f8,(value_type *)local_488);
              }
              local_488._8_8_ = 0;
              bVar4 = false;
            }
            local_488._8_8_ = 0;
            *(char *)local_488._0_8_ = '\0';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,
                            CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                                     local_538.field_2._M_local_buf[0]) + 1);
          }
        } while (!bVar4);
        if (((((local_55c == 0) ||
              ((ulong)((long)local_4f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_4f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) < local_4b0)) &&
             (local_488._8_8_ != 0)) &&
            ((local_518 <= (ulong)local_488._8_8_ &&
             (((local_508 & 1) == 0 ||
              (bVar4 = cmsys::RegularExpression::find
                                 (&local_100,(char *)local_488._0_8_,&local_100.regmatch), bVar4))))
            )) && ((local_558 < 0 || (local_488._8_4_ + (int)pbVar21 + 1 < local_558)))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4f8,(value_type *)local_488);
        }
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        local_538._M_string_length = 0;
        local_538.field_2._M_local_buf[0] = '\0';
        local_540 = local_4f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_4f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_4f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar21 = local_4f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::__cxx11::string::append((char *)&local_538);
            sVar2 = pbVar21->_M_string_length;
            if (sVar2 != 0) {
              pcVar1 = (pbVar21->_M_dataplus)._M_p;
              sVar25 = 0;
              do {
                cVar24 = (char)&local_538;
                if (pcVar1[sVar25] == ';') {
                  std::__cxx11::string::push_back(cVar24);
                }
                std::__cxx11::string::push_back(cVar24);
                sVar25 = sVar25 + 1;
              } while (sVar2 != sVar25);
            }
            pbVar21 = pbVar21 + 1;
          } while (pbVar21 != local_540);
        }
        cmMakefile::AddDefinition(local_550->Makefile,&local_4a8,local_538._M_dataplus._M_p);
        uVar12 = (ulong)local_4d4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,
                          CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                                   local_538.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
          operator_delete((void *)local_488._0_8_,CONCAT71(local_488._17_7_,local_488[0x10]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4f8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_488,"STRINGS file \"",0xe);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,local_4d0._M_dataplus._M_p,
                             local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" cannot be read.",0x11);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar3,&local_538);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,
                          CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                                   local_538.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
        std::ios_base::~ios_base(local_418);
      }
      uVar19 = (undefined1)uVar12;
      std::ifstream::~ifstream(local_308);
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)uVar19;
LAB_00207811:
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar14 = (string *)
            ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21 >> 5);
  bVar4 = psVar27 < psVar14;
  bVar5 = psVar14 <= psVar27;
  unaff_RBX = psVar27;
  psVar14 = psVar27;
  psVar27 = (string *)(ulong)((int)psVar27 + 1);
  if (bVar5) goto LAB_00207870;
  goto LAB_0020727c;
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
  }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg__maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        std::ostringstream e;
        e << "STRINGS option REGEX value \"" << args[i]
          << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        std::ostringstream e;
        e << "STRINGS option ENCODING \"" << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else {
      std::ostringstream e;
      e << "STRINGS given unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += "/CMakeFiles";
    binaryFileName += "/FileCommandStringsBinaryFile";
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}